

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL> *
__thiscall
cppqc::detail::
ArrayOfStatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
::unGen(ArrayOfStatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
        *this,RngEngine *rng,size_t size)

{
  reference this_00;
  size_t in_RSI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
  *in_RDI;
  size_t i;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
  *result;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
  *this_01;
  RngEngine *in_stack_ffffffffffffffa0;
  StatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  string local_50 [32];
  ulong local_30;
  undefined1 local_21;
  
  local_21 = 0;
  this_01 = in_RDI;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>::
  array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
         *)in_stack_ffffffffffffffa0);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    StatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::unGen(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RSI);
    this_00 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
              ::operator[](this_01,(size_type)in_RDI);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return this_01;
}

Assistant:

std::array<T, N> unGen(RngEngine& rng, std::size_t size) const {
    std::array<T, N> result;
    for (size_t i = 0; i < N; i++)
      result[i] = m_gen.unGen(rng, size);
    return result;
  }